

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<std::complex<double>_>::Zero(TPZFileEqnStorage<std::complex<double>_> *this)

{
  int __fd;
  char *__filename;
  ostream *poVar1;
  FILE *pFVar2;
  long in_RDI;
  int zero;
  int fdtmp;
  int64_t in_stack_00000018;
  TPZManVector<long,_10> *in_stack_00000020;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (*(long *)(in_RDI + 0xa0) != 0) {
    FinishWriting((TPZFileEqnStorage<std::complex<double>_> *)
                  CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  strcpy(filenamestorage,"/tmp/binary_frontalXXXXXX");
  __fd = mkstemp(filenamestorage);
  poVar1 = std::operator<<((ostream *)&std::cout,"Temporary file name ");
  poVar1 = std::operator<<(poVar1,filenamestorage);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  TPZManVector<long,_10>::Resize(in_stack_00000020,in_stack_00000018);
  *(undefined4 *)(in_RDI + 0xac) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  *(undefined4 *)(in_RDI + 0xa8) = 0;
  *(undefined4 *)(in_RDI + 8) = 0x14;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x80),filenamestorage);
  pFVar2 = fdopen(__fd,"wb");
  *(FILE **)(in_RDI + 0xa0) = pFVar2;
  fwrite((void *)(in_RDI + 8),4,1,*(FILE **)(in_RDI + 0xa0));
  fwrite(&stack0xfffffffffffffff0,4,1,*(FILE **)(in_RDI + 0xa0));
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Zero()
{
	if(fIOStream) FinishWriting();
	remove(fFileName.c_str());
	
	strcpy(filenamestorage, "/tmp/binary_frontalXXXXXX");
	
	int fdtmp = -1;
#ifdef WIN32
	_mktemp(filenamestorage);
#else
	fdtmp = mkstemp(filenamestorage); //returns file description for tmp file
#endif
	cout << "Temporary file name " << filenamestorage << endl;
	cout.flush();
	
	fBlockPos.Resize(0);
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=20;
	
	fFileName = filenamestorage;
#ifdef WIN32
	fIOStream = fopen(filenamestorage,"wb"); //open for writing
#else
	fIOStream = fdopen(fdtmp,"wb"); //open for writing
#endif
	/**
	 *Writes NumHeaders and NumBlocks information in
	 *the two initial positions on fIOStream
	 */
	int zero = 0;
	fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
	fwrite(&zero,sizeof(int),1,fIOStream);
}